

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void testing::internal::
     DefaultPrintTo<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (undefined8 *param_1,ostream *param_2)

{
  long lVar1;
  string *psVar2;
  
  std::operator<<(param_2,'{');
  psVar2 = (string *)*param_1;
  lVar1 = 0;
  do {
    if (psVar2 == (string *)param_1[1]) {
      if (lVar1 != 0) {
LAB_00151644:
        std::operator<<(param_2,' ');
      }
      std::operator<<(param_2,'}');
      return;
    }
    if ((lVar1 != 0) && (std::operator<<(param_2,','), lVar1 == 0x20)) {
      std::operator<<(param_2," ...");
      goto LAB_00151644;
    }
    std::operator<<(param_2,' ');
    testing::internal::PrintStringTo(psVar2,param_2);
    psVar2 = psVar2 + 0x20;
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}